

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman_int.cpp
# Opt level: O0

uint32_t get_X(istream *is)

{
  istream *piVar1;
  bool local_5d;
  allocator<char> local_49;
  string local_48;
  uint local_24;
  char local_1d;
  uint32_t repeats;
  char ch;
  istream *piStack_18;
  uint32_t num;
  istream *is_local;
  
  repeats = 0;
  local_24 = 0;
  piStack_18 = is;
  do {
    while( true ) {
      local_5d = false;
      if (local_24 < 3) {
        piVar1 = std::operator>>(piStack_18,&local_1d);
        local_5d = std::ios::operator_cast_to_bool
                             ((ios *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18)));
      }
      if (local_5d == false) {
        return repeats;
      }
      if (local_1d != 'C') break;
      if (local_24 == 1) {
        return repeats + 0x50;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Invalid roman numeral.",&local_49);
      error(&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
LAB_001083c3:
      if (local_24 != 0) {
        return repeats + 0x1e;
      }
      repeats = repeats + 0x32;
    }
    if (local_1d == 'L') goto LAB_001083c3;
    if (local_1d != 'X') {
      std::istream::unget();
      return repeats;
    }
    repeats = repeats + 10;
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

uint32_t get_X(std::istream& is)
{
	uint32_t num{ 0 };
	char ch;
	uint32_t repeats{ 0 };
	while (repeats < Roman_int::max_repeating_numerals && is >> ch)
	{
		switch (ch)
		{
		case 'C':
		{
			if (repeats == 1)
			{
				return num + 80;
			}
			else
			{
				error("Invalid roman numeral.");
			}
		}
		case 'L':
		{
			if (repeats > 0)
			{
				return num + 30;
			}
			else
			{
				num += 50;
			}
			break;
		}
		case 'X':
		{
			num += 10;
			++repeats;
			break;
		}
		default:
			is.unget();
			return num;
		}
	}
	return num;
}